

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sattrack.cc
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  int iVar3;
  DateTime dt;
  Eci eci;
  CoordGeodetic geo;
  CoordTopocentric topo;
  Tle tle;
  Observer obs;
  SGP4 sgp4;
  string local_540;
  DateTime local_520;
  string local_518;
  string local_4f8;
  string local_4d8;
  undefined1 local_4b8 [72];
  CoordGeodetic local_470;
  CoordTopocentric local_458;
  Tle local_438;
  Observer local_360;
  SGP4 local_300;
  
  libsgp4::Observer::Observer(&local_360,51.507406923983446,-0.12773752212524414,0.05);
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d8,"UK-DMC 2                ","");
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,
             "1 35683U 09041C   12289.23158813  .00000484  00000-0  89219-4 0  5863","");
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_518,
             "2 35683  98.0221 185.3682 0001499 100.5295 259.6088 14.69819587172294","");
  libsgp4::Tle::Tle(&local_438,&local_4d8,&local_4f8,&local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  libsgp4::OrbitalElements::OrbitalElements(&local_300.elements_,&local_438);
  libsgp4::SGP4::Initialise(&local_300);
  libsgp4::Tle::ToString_abi_cxx11_((string *)local_4b8,&local_438);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_4b8._0_8_,local_4b8._8_8_);
  if ((undefined1 *)local_4b8._0_8_ != local_4b8 + 0x10) {
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  paVar1 = &local_540.field_2;
  iVar3 = 0;
  do {
    local_520.m_encoded = (long)((double)iVar3 * 60000000.0) + local_438.epoch_.m_encoded;
    libsgp4::SGP4::FindPosition((Eci *)local_4b8,&local_300,&local_520);
    libsgp4::Observer::GetLookAngle(&local_458,&local_360,(Eci *)local_4b8);
    libsgp4::Eci::ToGeodetic(&local_470,(Eci *)local_4b8);
    libsgp4::DateTime::ToString_abi_cxx11_(&local_540,&local_520);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_540._M_dataplus._M_p,local_540._M_string_length)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != paVar1) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    libsgp4::CoordTopocentric::ToString_abi_cxx11_(&local_540,&local_458);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_540._M_dataplus._M_p,local_540._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != paVar1) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    libsgp4::CoordGeodetic::ToString_abi_cxx11_(&local_540,&local_470);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_540._M_dataplus._M_p,local_540._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != paVar1) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    iVar3 = iVar3 + 10;
  } while (iVar3 != 100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.int_designator_._M_dataplus._M_p != &local_438.int_designator_.field_2) {
    operator_delete(local_438.int_designator_._M_dataplus._M_p,
                    local_438.int_designator_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.line_two_._M_dataplus._M_p != &local_438.line_two_.field_2) {
    operator_delete(local_438.line_two_._M_dataplus._M_p,
                    local_438.line_two_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.line_one_._M_dataplus._M_p != &local_438.line_one_.field_2) {
    operator_delete(local_438.line_one_._M_dataplus._M_p,
                    local_438.line_one_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.name_._M_dataplus._M_p != &local_438.name_.field_2) {
    operator_delete(local_438.name_._M_dataplus._M_p,
                    local_438.name_.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
    libsgp4::Observer obs(51.507406923983446, -0.12773752212524414, 0.05);
    libsgp4::Tle tle = libsgp4::Tle("UK-DMC 2                ",
        "1 35683U 09041C   12289.23158813  .00000484  00000-0  89219-4 0  5863",
        "2 35683  98.0221 185.3682 0001499 100.5295 259.6088 14.69819587172294");
    libsgp4::SGP4 sgp4(tle);

    std::cout << tle << std::endl;

    for (int i = 0; i < 10; ++i)
    {
        libsgp4::DateTime dt = tle.Epoch().AddMinutes(i * 10);
        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(dt);
        /*
         * get look angle for observer to satellite
         */
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);
        /*
         * convert satellite position to geodetic coordinates
         */
        libsgp4::CoordGeodetic geo = eci.ToGeodetic();

        std::cout << dt << " " << topo << " " << geo << std::endl;
    };

    return 0;
}